

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O1

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits,bool val)

{
  int iVar1;
  uint *puVar2;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  _Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(uint *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  }
  if (uVar6 != bits) {
    uVar7 = 0;
    uVar6 = 0;
    if (_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
      uVar6 = *(uint *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      uVar7 = *(uint *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl & 0x1f;
    }
    resize(this,bits);
    _Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>;
    if (_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = *(int *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    }
    if ((int)uVar6 < iVar4) {
      iVar4 = uVar6 + 0x3e;
      if (-1 < (int)(uVar6 + 0x1f)) {
        iVar4 = uVar6 + 0x1f;
      }
      if (_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar1 = *(int *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x1f;
        iVar5 = *(int *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x3e;
        if (-1 < iVar1) {
          iVar5 = iVar1;
        }
        iVar5 = iVar5 >> 5;
      }
      iVar4 = iVar4 >> 5;
      if (val) {
        if (uVar7 != 0 && uVar6 - 1 < 0xffffffc1) {
          uVar6 = 0xffffffff >> (sbyte)uVar7;
          puVar2 = (uint *)((long)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                           (long)iVar4 * 4);
          *puVar2 = *puVar2 | uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18;
        }
        if (iVar5 - iVar4 != 0 && iVar4 <= iVar5) {
          memset((int *)((long)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                        (long)iVar4 * 4) + 1,0xff,(long)(iVar5 - iVar4) << 2);
        }
        clear_trailing_bits(this);
        return;
      }
      if (iVar5 - iVar4 != 0 && iVar4 <= iVar5) {
        memset((int *)((long)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                      (long)iVar4 * 4) + 1,0,(long)(iVar5 - iVar4) << 2);
        return;
      }
    }
  }
  return;
}

Assistant:

void bitfield::resize(int const bits, bool const val)
	{
		if (bits == size()) return;

		int const s = size();
		int const b = size() & 31;
		resize(bits);
		if (s >= size()) return;
		int const old_size_words = (s + 31) / 32;
		int const new_size_words = num_words();
		if (val)
		{
			if (old_size_words && b) buf()[old_size_words - 1] |= aux::host_to_network(0xffffffff >> b);
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0xff
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
			clear_trailing_bits();
		}
		else
		{
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0x00
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
		}
		TORRENT_ASSERT(size() == bits);
	}